

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O1

bool __thiscall
DisasmReplayer::enqueue_create_sampler
          (DisasmReplayer *this,Hash hash,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  pointer *pppVVar1;
  pointer *pppVVar2;
  iterator __position;
  iterator __position_00;
  ulong extraout_RAX;
  VkSamplerCreateInfo *local_18;
  
  local_18 = create_info;
  if (this->device == (VulkanDevice *)0x0) {
    *sampler = (VkSampler)hash;
  }
  else {
    enqueue_create_sampler();
    if ((extraout_RAX & 1) == 0) {
      return false;
    }
  }
  __position._M_current =
       (this->samplers).super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->samplers).super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkSampler_T*,std::allocator<VkSampler_T*>>::_M_realloc_insert<VkSampler_T*const&>
              ((vector<VkSampler_T*,std::allocator<VkSampler_T*>> *)&this->samplers,__position,
               sampler);
  }
  else {
    *__position._M_current = *sampler;
    pppVVar2 = &(this->samplers).super__Vector_base<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppVVar2 = *pppVVar2 + 1;
  }
  __position_00._M_current =
       (this->sampler_infos).
       super__Vector_base<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->sampler_infos).
      super__Vector_base<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkSamplerCreateInfo_const*,std::allocator<VkSamplerCreateInfo_const*>>::
    _M_realloc_insert<VkSamplerCreateInfo_const*const&>
              ((vector<VkSamplerCreateInfo_const*,std::allocator<VkSamplerCreateInfo_const*>> *)
               &this->sampler_infos,__position_00,&local_18);
  }
  else {
    *__position_00._M_current = local_18;
    pppVVar1 = &(this->sampler_infos).
                super__Vector_base<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  return true;
}

Assistant:

bool enqueue_create_sampler(Hash hash, const VkSamplerCreateInfo *create_info, VkSampler *sampler) override
	{
		if (device)
		{
			LOGI("Creating sampler %0" PRIX64 "\n", hash);
			if (device->create_sampler_with_ycbcr_remap(create_info, sampler) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*sampler = fake_handle<VkSampler>(hash);

		samplers.push_back(*sampler);
		sampler_infos.push_back(create_info);
		return true;
	}